

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O1

WeierstrassPoint * ecc_weierstrass_double(WeierstrassPoint *P)

{
  WeierstrassCurve *pWVar1;
  WeierstrassPoint *out;
  mp_int *lambda_d;
  mp_int *lambda_n;
  mp_int *local_30;
  mp_int *local_28;
  
  pWVar1 = P->wc;
  out = (WeierstrassPoint *)safemalloc(1,0x20,0);
  out->wc = pWVar1;
  out->X = (mp_int *)0x0;
  out->Y = (mp_int *)0x0;
  out->Z = (mp_int *)0x0;
  ecc_weierstrass_tangent_slope(P,&local_28,&local_30);
  ecc_weierstrass_epilogue(P->X,P->X,P->Y,P->Z,local_28,local_30,out);
  mp_free(local_28);
  mp_free(local_30);
  return out;
}

Assistant:

WeierstrassPoint *ecc_weierstrass_double(WeierstrassPoint *P)
{
    WeierstrassCurve *wc = P->wc;
    WeierstrassPoint *D = ecc_weierstrass_point_new_empty(wc);

    mp_int *lambda_n, *lambda_d;
    ecc_weierstrass_tangent_slope(P, &lambda_n, &lambda_d);
    ecc_weierstrass_epilogue(P->X, P->X, P->Y, P->Z, lambda_n, lambda_d, D);
    mp_free(lambda_n);
    mp_free(lambda_d);

    return D;
}